

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyInternals.h
# Opt level: O0

btScalar ImplicitSolve(ImplicitFn *fn,btVector3 *a,btVector3 *b,btScalar accuracy,int maxiterations)

{
  int in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  float in_XMM0_Da;
  float fVar1;
  float fVar2;
  btScalar bVar3;
  btScalar v;
  btScalar t;
  int i;
  btScalar values [2];
  btScalar span [2];
  btScalar local_54 [4];
  float local_44;
  float local_40;
  btScalar t_00;
  btVector3 *a_00;
  
  a_00 = (btVector3 *)0x3f80000000000000;
  fVar1 = (float)(**(code **)(*in_RDI + 0x10))(in_RDI,in_RSI);
  fVar2 = (float)(**(code **)(*in_RDI + 0x10))(in_RDI,in_RDX);
  if (fVar2 < fVar1) {
    btSwap<float>((float *)&stack0xffffffffffffffd0,(float *)&stack0xffffffffffffffd4);
    btSwap<float>((float *)&stack0xffffffffffffffc8,(float *)&stack0xffffffffffffffcc);
  }
  if ((fVar1 <= -in_XMM0_Da) && (in_XMM0_Da <= fVar2)) {
    for (t_00 = 0.0; (int)t_00 < in_ECX; t_00 = (btScalar)((int)t_00 + 1)) {
      local_40 = Lerp<float>((float *)&stack0xffffffffffffffd0,(float *)&stack0xffffffffffffffd4,
                             fVar1 / (fVar1 - fVar2));
      local_54 = (btScalar  [4])Lerp<btVector3>(a_00,(btVector3 *)CONCAT44(fVar2,fVar1),t_00);
      local_44 = (float)(**(code **)(*in_RDI + 0x10))(in_RDI,local_54);
      if (local_40 <= 0.0) {
        return -1.0;
      }
      if (1.0 <= local_40) {
        return -1.0;
      }
      bVar3 = btFabs(local_44);
      if (bVar3 < in_XMM0_Da) {
        return local_40;
      }
      if (0.0 <= local_44) {
        a_00 = (btVector3 *)CONCAT44(local_40,SUB84(a_00,0));
        fVar2 = local_44;
      }
      else {
        a_00 = (btVector3 *)CONCAT44((float)((ulong)a_00 >> 0x20),local_40);
        fVar1 = local_44;
      }
    }
  }
  return -1.0;
}

Assistant:

static btScalar				ImplicitSolve(	btSoftBody::ImplicitFn* fn,
										  const btVector3& a,
										  const btVector3& b,
										  const btScalar accuracy,
										  const int maxiterations=256)
{
	btScalar	span[2]={0,1};
	btScalar	values[2]={fn->Eval(a),fn->Eval(b)};
	if(values[0]>values[1])
	{
		btSwap(span[0],span[1]);
		btSwap(values[0],values[1]);
	}
	if(values[0]>-accuracy) return(-1);
	if(values[1]<+accuracy) return(-1);
	for(int i=0;i<maxiterations;++i)
	{
		const btScalar	t=Lerp(span[0],span[1],values[0]/(values[0]-values[1]));
		const btScalar	v=fn->Eval(Lerp(a,b,t));
		if((t<=0)||(t>=1))		break;
		if(btFabs(v)<accuracy)	return(t);
		if(v<0)
		{ span[0]=t;values[0]=v; }
		else
		{ span[1]=t;values[1]=v; }
	}
	return(-1);
}